

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::Mock::RegisterUseByOnCallOrExpectCall(void *mock_obj,char *file,int line)

{
  mapped_type *pmVar1;
  TestInfo *pTVar2;
  key_type *__k;
  MutexLock l;
  GTestMutexLock local_28;
  void *local_20;
  
  local_28.mutex_ = (MutexBase *)internal::g_gmock_mutex;
  __k = (key_type *)file;
  local_20 = mock_obj;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  pmVar1 = std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                         *)&local_20,__k);
  if (pmVar1->first_used_file == (char *)0x0) {
    pmVar1->first_used_file = file;
    pmVar1->first_used_line = line;
    UnitTest::GetInstance();
    pTVar2 = UnitTest::current_test_info(&UnitTest::GetInstance::instance);
    if (pTVar2 != (TestInfo *)0x0) {
      std::__cxx11::string::assign((char *)&pmVar1->first_used_test_case);
      std::__cxx11::string::assign((char *)&pmVar1->first_used_test);
    }
  }
  internal::GTestMutexLock::~GTestMutexLock(&local_28);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  MockObjectState& state = g_mock_object_registry.states()[mock_obj];
  if (state.first_used_file == NULL) {
    state.first_used_file = file;
    state.first_used_line = line;
    const TestInfo* const test_info =
        UnitTest::GetInstance()->current_test_info();
    if (test_info != NULL) {
      // TODO(wan@google.com): record the test case name when the
      // ON_CALL or EXPECT_CALL is invoked from SetUpTestCase() or
      // TearDownTestCase().
      state.first_used_test_case = test_info->test_case_name();
      state.first_used_test = test_info->name();
    }
  }
}